

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall pugi::xml_text::set(xml_text *this,int rhs)

{
  bool bVar1;
  xml_node_struct *header;
  char buf [128];
  char_t acStack_a8 [136];
  
  header = _data_new(this);
  if (header == (xml_node_struct *)0x0) {
    bVar1 = false;
  }
  else {
    sprintf(acStack_a8,"%d",rhs);
    bVar1 = impl::anon_unknown_0::strcpy_insitu(&header->value,&header->header,8,acStack_a8);
  }
  return bVar1;
}

Assistant:

PUGI__FN bool xml_text::set(int rhs)
	{
		xml_node_struct* dn = _data_new();

		return dn ? impl::set_value_convert(dn->value, dn->header, impl::xml_memory_page_value_allocated_mask, rhs) : false;
	}